

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

void __thiscall nuraft::stat_elem::~stat_elem(stat_elem *this)

{
  Histogram *this_00;
  
  this_00 = this->hist_;
  if (this_00 != (Histogram *)0x0) {
    Histogram::~Histogram(this_00);
  }
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&this->stat_name_);
  return;
}

Assistant:

stat_elem::~stat_elem() {
    delete hist_;
}